

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>::rehash
          (HashIndex<kj::_::(anonymous_namespace)::BadHasher> *this,size_t targetSize)

{
  long lVar1;
  undefined8 uVar2;
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> local_20;
  
  oldBuckets.size_ = targetSize;
  oldBuckets.ptr = *(HashBucket **)(this + 0x18);
  _::rehash(&local_20,*(_ **)(this + 0x10),oldBuckets,in_R8);
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)(this + 0x18);
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    (**(code **)**(undefined8 **)(this + 0x20))(*(undefined8 **)(this + 0x20),lVar1,8,uVar2,uVar2,0)
    ;
  }
  *(HashBucket **)(this + 0x10) = local_20.ptr;
  *(size_t *)(this + 0x18) = local_20.size_;
  *(ArrayDisposer **)(this + 0x20) = local_20.disposer;
  *(undefined8 *)(this + 8) = 0;
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
    erasedCount = 0;
  }